

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.h
# Opt level: O2

void __thiscall
KDTree<YaoMST::PointPair,_2,_YaoMST::OldAt>::KDTree
          (KDTree<YaoMST::PointPair,_2,_YaoMST::OldAt> *this,PointPair *first,PointPair *last)

{
  int d;
  long lVar1;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_MashPlant[P]MST_testcase____src_KDTree_h:134:64)>
  __comp;
  pair<YaoMST::PointPair_*,_YaoMST::PointPair_*> pVar2;
  allocator_type local_39;
  vector<int,_std::allocator<int>_> *local_38;
  
  this->first = first;
  this->last = last;
  local_38 = &this->split;
  std::vector<int,_std::allocator<int>_>::vector
            (local_38,((long)last - (long)first) / 0x28,&local_39);
  build(this,first,last);
  __comp._M_comp = (anon_class_8_2_d5c7ce73_for__M_comp)0x0;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    pVar2 = std::
            __minmax_element<YaoMST::PointPair*,__gnu_cxx::__ops::_Iter_comp_iter<KDTree<YaoMST::PointPair,2,YaoMST::OldAt>::KDTree(YaoMST::PointPair*,YaoMST::PointPair*,YaoMST::OldAt)::_lambda(YaoMST::PointPair_const&,YaoMST::PointPair_const&)_1_>>
                      (first,last,__comp);
    this->min[lVar1] = (&((pVar2.first)->oPoint).x)[lVar1];
    this->max[lVar1] = (&((pVar2.second)->oPoint).x)[lVar1];
    __comp._M_comp = __comp._M_comp + 0x100000000;
  }
  return;
}

Assistant:

KDTree(Point *first, Point *last, Coordinate coordinate = Coordinate())
			: first(first), last(last), coordinate(coordinate), split(last - first)
	{
		build(first, last);
		for (int d = 0; d < K; ++d)
		{
			auto[minPoint, maxPoint] = std::minmax_element(first, last, [=](const Point &lhs, const Point &rhs)
			{ return coordinate(lhs, d) < coordinate(rhs, d); });
			min[d] = coordinate(const_cast<const Point &>(*minPoint), d);
			max[d] = coordinate(const_cast<const Point &>(*maxPoint), d);
		}
	}